

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq_test.c
# Opt level: O3

void test_xreq_identity(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  char *local_40;
  char *n1;
  char *n2;
  uint16_t p1;
  uint16_t p2;
  nng_socket s;
  
  nVar1 = nng_req0_open_raw((nng_socket *)((long)&n2 + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x1a,"%s: expected success, got %s (%d)","nng_req0_open_raw(&s)",pcVar3,
                         nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_socket_proto_id(n2._4_4_,(uint16_t *)&n2);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                           ,0x1b,"%s: expected success, got %s (%d)","nng_socket_proto_id(s, &p1)",
                           pcVar3,nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_socket_peer_id(n2._4_4_,(uint16_t *)((long)&n2 + 2));
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                             ,0x1c,"%s: expected success, got %s (%d)","nng_socket_peer_id(s, &p2)",
                             pcVar3,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_socket_proto_name(n2._4_4_,&local_40);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                               ,0x1d,"%s: expected success, got %s (%d)",
                               "nng_socket_proto_name(s, &n1)",pcVar3,nVar1);
        if (iVar2 != 0) {
          nVar1 = nng_socket_peer_name(n2._4_4_,&n1);
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                 ,0x1e,"%s: expected success, got %s (%d)",
                                 "nng_socket_peer_name(s, &n2)",pcVar3,nVar1);
          if (iVar2 != 0) {
            nVar1 = nng_socket_close(n2._4_4_);
            pcVar3 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                                   ,0x1f,"%s: expected success, got %s (%d)","nng_socket_close(s)",
                                   pcVar3,nVar1);
            if (iVar2 != 0) {
              acutest_check_((uint)((short)n2 == 0x30),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                             ,0x20,"%s","p1 == REQ0_SELF");
              acutest_check_((uint)(n2._2_2_ == 0x31),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                             ,0x21,"%s","p2 == REQ0_PEER");
              iVar2 = strcmp(local_40,"req");
              acutest_check_((uint)(iVar2 == 0),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                             ,0x22,"%s == %s",local_40,"req",nVar1);
              iVar2 = strcmp(n1,"rep");
              acutest_check_((uint)(iVar2 == 0),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                             ,0x23,"%s == %s",n1,"rep");
              return;
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

static void
test_xreq_identity(void)
{
	nng_socket  s;
	uint16_t    p1, p2;
	const char *n1;
	const char *n2;

	NUTS_PASS(nng_req0_open_raw(&s));
	NUTS_PASS(nng_socket_proto_id(s, &p1));
	NUTS_PASS(nng_socket_peer_id(s, &p2));
	NUTS_PASS(nng_socket_proto_name(s, &n1));
	NUTS_PASS(nng_socket_peer_name(s, &n2));
	NUTS_CLOSE(s);
	NUTS_TRUE(p1 == REQ0_SELF);
	NUTS_TRUE(p2 == REQ0_PEER);
	NUTS_MATCH(n1, REQ0_SELF_NAME);
	NUTS_MATCH(n2, REQ0_PEER_NAME);
}